

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_cell(REF_NODE ref_node,REF_CELL ref_cell,REF_BOOL faceid_insted_of_c2n,REF_BOOL always_id
               ,REF_BOOL swap_endian,REF_BOOL sixty_four_bit,REF_BOOL select_faceid,REF_INT faceid,
               REF_BOOL pad,FILE *file)

{
  REF_STATUS RVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  REF_CELL pRVar9;
  undefined8 uVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  REF_MPI ref_mpi;
  ulong uVar15;
  undefined4 in_stack_00000014;
  REF_INT ncell;
  REF_INT part;
  REF_INT zero_1;
  REF_INT nodes [27];
  uint local_1f4;
  uint local_1f0;
  int local_1ec;
  ulong local_1e8;
  REF_CELL local_1e0;
  long local_1d8;
  void *local_1d0;
  int local_1c4;
  REF_INT local_1c0;
  REF_BOOL local_1bc;
  long local_1b8;
  REF_MPI local_1b0;
  undefined4 local_1a8;
  REF_BOOL local_1a4;
  void *local_1a0;
  void *local_198;
  long local_190;
  ulong auStack_188 [4];
  undefined8 uStack_168;
  REF_INT local_a8 [30];
  
  local_1d0 = (void *)CONCAT44(local_1d0._4_4_,sixty_four_bit);
  local_1b0 = ref_node->ref_mpi;
  uVar3 = ref_cell->node_per;
  local_1d8 = (long)(int)uVar3;
  uVar15 = (ulong)uVar3;
  local_1b8 = (long)ref_cell->size_per;
  local_1e0 = ref_cell;
  local_1bc = always_id;
  local_1a4 = faceid_insted_of_c2n;
  if ((local_1b0->id == 0) && (0 < ref_cell->max)) {
    iVar13 = 0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,iVar13,local_a8);
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,ref_node,iVar13,&local_1c4);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x79a,"ref_gather_cell",(ulong)uVar2,"part");
          return uVar2;
        }
        ref_cell = local_1e0;
        if (local_1b0->id == local_1c4) {
          if (0 < (int)local_1d8) {
            uVar6 = 0;
            do {
              iVar11 = local_a8[uVar6];
              if (((long)iVar11 < 0) || (ref_node->max <= iVar11)) {
                uVar7 = 0;
              }
              else {
                uVar7 = 0;
                if (-1 < ref_node->global[iVar11]) {
                  uVar7 = ref_node->global[iVar11] + 1;
                }
              }
              auStack_188[uVar6] = uVar7;
              uVar6 = uVar6 + 1;
            } while (uVar15 != uVar6);
          }
          auStack_188[local_1d8] = 0;
          if ((int)uVar3 < (int)local_1b8) {
            auStack_188[local_1d8] = (long)local_a8[local_1d8];
          }
          uVar7 = auStack_188[2];
          uVar6 = auStack_188[1];
          if ((local_1bc != 0) && (local_1e0->type == REF_CELL_PYR)) {
            auStack_188[1] = auStack_188[3];
            auStack_188[2] = uStack_168;
            auStack_188[3] = uVar6;
            uStack_168 = uVar7;
          }
          if (local_1a4 == 0) {
            if (0 < (int)uVar3) {
              uVar6 = 0;
              do {
                uVar7 = auStack_188[uVar6];
                if ((int)local_1d0 == 0) {
                  local_1f0 = (uint)uVar7;
                  if (swap_endian != 0) {
                    local_1f0 = local_1f0 >> 0x18 | (local_1f0 & 0xff0000) >> 8 |
                                (local_1f0 & 0xff00) << 8 | local_1f0 << 0x18;
                  }
                  sVar5 = fwrite(&local_1f0,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    uVar10 = 0x7c7;
                    pcVar12 = "int cel node";
                    goto LAB_0013bb00;
                  }
                }
                else {
                  local_1e8 = uVar7;
                  if (swap_endian != 0) {
                    local_1e8 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                                (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                  }
                  sVar5 = fwrite(&local_1e8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    uVar10 = 0x7c2;
                    pcVar12 = "long cel node";
LAB_0013bb00:
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,uVar10,"ref_gather_cell",pcVar12,1,sVar5);
                    local_1f4 = 1;
                  }
                }
                if (sVar5 != 1) {
                  return local_1f4;
                }
                uVar6 = uVar6 + 1;
              } while (uVar15 != uVar6);
            }
            if (select_faceid != 0) {
              local_1ec = 0;
              sVar5 = fwrite(&local_1ec,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
              if (sVar5 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x7cd,"ref_gather_cell","zero pad",1,sVar5);
                return 1;
              }
            }
            ref_cell = local_1e0;
            if (local_1bc != 0) {
              uVar6 = auStack_188[local_1d8];
              if ((int)local_1d0 == 0) {
                local_1f0 = (uint)uVar6;
                if (swap_endian != 0) {
                  local_1f0 = local_1f0 >> 0x18 | (local_1f0 & 0xff0000) >> 8 |
                              (local_1f0 & 0xff00) << 8 | local_1f0 << 0x18;
                }
                sVar5 = fwrite(&local_1f0,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  uVar10 = 0x7d8;
                  goto LAB_0013bd00;
                }
              }
              else {
                local_1e8 = uVar6;
                if (swap_endian != 0) {
                  local_1e8 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                              (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                              (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                              (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
                }
                sVar5 = fwrite(&local_1e8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  uVar10 = 0x7d4;
                  goto LAB_0013bc3d;
                }
              }
              goto LAB_0013bd1d;
            }
          }
          else {
            uVar6 = auStack_188[local_1d8];
            if ((int)local_1d0 == 0) {
              local_1f0 = (uint)uVar6;
              if (swap_endian != 0) {
                local_1f0 = local_1f0 >> 0x18 | (local_1f0 & 0xff0000) >> 8 |
                            (local_1f0 & 0xff00) << 8 | local_1f0 << 0x18;
              }
              sVar5 = fwrite(&local_1f0,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
              if (sVar5 != 1) {
                uVar10 = 0x7ba;
LAB_0013bd00:
                pcVar12 = "int id";
                goto LAB_0013bd0e;
              }
            }
            else {
              local_1e8 = uVar6;
              if (swap_endian != 0) {
                local_1e8 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                            (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                            (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
              }
              sVar5 = fwrite(&local_1e8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
              if (sVar5 != 1) {
                uVar10 = 0x7b6;
LAB_0013bc3d:
                pcVar12 = "long id";
LAB_0013bd0e:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar10,"ref_gather_cell",pcVar12,1,sVar5);
                local_1f4 = 1;
              }
            }
LAB_0013bd1d:
            ref_cell = local_1e0;
            if (sVar5 != 1) {
              return local_1f4;
            }
          }
        }
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < ref_cell->max);
  }
  uVar2 = local_1f4;
  if (local_1b0->id == 0) {
    local_1f4 = 0;
    if (1 < local_1b0->n) {
      local_190 = local_1b8 * 8;
      local_1c0 = 1;
      do {
        local_1f4 = uVar2;
        ref_mpi = local_1b0;
        uVar2 = ref_mpi_gather_recv(local_1b0,&local_1ec,1,1,local_1c0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x7e3,"ref_gather_cell",(ulong)uVar2,"recv ncell");
          return uVar2;
        }
        if (0 < local_1ec) {
          uVar2 = local_1ec * (int)local_1b8;
          if ((int)uVar2 < 0) {
            uVar10 = 0x7e5;
            goto LAB_0013c314;
          }
          pvVar4 = malloc((ulong)uVar2 << 3);
          if (pvVar4 == (void *)0x0) {
            uVar10 = 0x7e5;
            goto LAB_0013c38c;
          }
          local_1a0 = pvVar4;
          uVar2 = ref_mpi_gather_recv(ref_mpi,pvVar4,uVar2,2,local_1c0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x7e8,"ref_gather_cell",(ulong)uVar2,"recv c2n");
            return uVar2;
          }
          if (0 < local_1ec) {
            local_198 = (void *)((long)local_1a0 + local_1d8 * 8);
            lVar14 = 0;
            pRVar9 = local_1e0;
            pvVar4 = local_1a0;
            do {
              if (0 < (int)local_1d8) {
                uVar6 = 0;
                do {
                  auStack_188[uVar6] = *(long *)((long)pvVar4 + uVar6 * 8) + 1;
                  uVar6 = uVar6 + 1;
                } while (uVar15 != uVar6);
              }
              auStack_188[local_1d8] = 0;
              if ((int)uVar3 < (int)local_1b8) {
                auStack_188[local_1d8] = *(ulong *)((long)local_198 + lVar14 * local_1b8 * 8);
              }
              uVar7 = auStack_188[2];
              uVar6 = auStack_188[1];
              if ((local_1bc != 0) && (pRVar9->type == REF_CELL_PYR)) {
                auStack_188[1] = auStack_188[3];
                auStack_188[2] = uStack_168;
                auStack_188[3] = uVar6;
                uStack_168 = uVar7;
              }
              if (local_1a4 == 0) {
                if (0 < (int)local_1d8) {
                  uVar6 = 0;
                  do {
                    uVar7 = auStack_188[uVar6];
                    if ((int)local_1d0 == 0) {
                      local_1f0 = (uint)uVar7;
                      if (swap_endian != 0) {
                        local_1f0 = local_1f0 >> 0x18 | (local_1f0 & 0xff0000) >> 8 |
                                    (local_1f0 & 0xff00) << 8 | local_1f0 << 0x18;
                      }
                      sVar5 = fwrite(&local_1f0,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                      if (sVar5 != 1) {
                        uVar10 = 0x816;
                        pcVar12 = "int cel node";
                        goto LAB_0013c06d;
                      }
                    }
                    else {
                      local_1e8 = uVar7;
                      if (swap_endian != 0) {
                        local_1e8 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                      }
                      sVar5 = fwrite(&local_1e8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                      if (sVar5 != 1) {
                        uVar10 = 0x811;
                        pcVar12 = "long cel node";
LAB_0013c06d:
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,uVar10,"ref_gather_cell",pcVar12,1,sVar5);
                        local_1f4 = 1;
                      }
                    }
                    if (sVar5 != 1) {
                      return local_1f4;
                    }
                    uVar6 = uVar6 + 1;
                    pRVar9 = local_1e0;
                  } while (uVar15 != uVar6);
                }
                if (select_faceid != 0) {
                  local_1a8 = 0;
                  sVar5 = fwrite(&local_1a8,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  pRVar9 = local_1e0;
                  if (sVar5 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x81c,"ref_gather_cell","zero pad",1,sVar5);
                    return 1;
                  }
                }
                if (local_1bc != 0) {
                  uVar6 = auStack_188[local_1d8];
                  if ((int)local_1d0 == 0) {
                    local_1f0 = (uint)uVar6;
                    if (swap_endian != 0) {
                      local_1f0 = local_1f0 >> 0x18 | (local_1f0 & 0xff0000) >> 8 |
                                  (local_1f0 & 0xff00) << 8 | local_1f0 << 0x18;
                    }
                    sVar5 = fwrite(&local_1f0,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                    if (sVar5 != 1) {
                      uVar10 = 0x827;
                      goto LAB_0013c26d;
                    }
                  }
                  else {
                    local_1e8 = uVar6;
                    if (swap_endian != 0) {
                      local_1e8 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                                  (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                                  (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                                  (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
                    }
                    sVar5 = fwrite(&local_1e8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                    if (sVar5 != 1) {
                      uVar10 = 0x823;
                      goto LAB_0013c1aa;
                    }
                  }
                  goto LAB_0013c28a;
                }
              }
              else {
                uVar6 = auStack_188[local_1d8];
                if ((int)local_1d0 == 0) {
                  local_1f0 = (uint)uVar6;
                  if (swap_endian != 0) {
                    local_1f0 = local_1f0 >> 0x18 | (local_1f0 & 0xff0000) >> 8 |
                                (local_1f0 & 0xff00) << 8 | local_1f0 << 0x18;
                  }
                  sVar5 = fwrite(&local_1f0,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    uVar10 = 0x809;
LAB_0013c26d:
                    pcVar12 = "int id";
                    goto LAB_0013c27b;
                  }
                }
                else {
                  local_1e8 = uVar6;
                  if (swap_endian != 0) {
                    local_1e8 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                                (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                                (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
                  }
                  sVar5 = fwrite(&local_1e8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    uVar10 = 0x805;
LAB_0013c1aa:
                    pcVar12 = "long id";
LAB_0013c27b:
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,uVar10,"ref_gather_cell",pcVar12,1,sVar5);
                    local_1f4 = 1;
                  }
                }
LAB_0013c28a:
                pRVar9 = local_1e0;
                if (sVar5 != 1) {
                  return local_1f4;
                }
              }
              lVar14 = lVar14 + 1;
              pvVar4 = (void *)((long)pvVar4 + local_190);
            } while (lVar14 < local_1ec);
          }
          free(local_1a0);
          ref_mpi = local_1b0;
        }
        uVar2 = local_1f4;
        local_1c0 = local_1c0 + 1;
        local_1f4 = 0;
      } while (local_1c0 < ref_mpi->n);
    }
  }
  else {
    local_1ec = 0;
    if (0 < ref_cell->max) {
      iVar13 = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,iVar13,local_a8);
        if (RVar1 == 0) {
          uVar2 = ref_cell_part(ref_cell,ref_node,iVar13,&local_1c4);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x832,"ref_gather_cell",(ulong)uVar2,"part");
            return uVar2;
          }
          ref_cell = local_1e0;
          if (local_1b0->id == local_1c4) {
            local_1ec = local_1ec + 1;
          }
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < ref_cell->max);
    }
    uVar2 = ref_mpi_gather_send(local_1b0,&local_1ec,1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x837,"ref_gather_cell",(ulong)uVar2,"send ncell");
      local_1f4 = uVar2;
    }
    lVar14 = local_1b8;
    iVar13 = (int)local_1b8;
    if (uVar2 == 0) {
      if (0 < local_1ec) {
        if (local_1ec * iVar13 < 0) {
          uVar10 = 0x839;
LAB_0013c314:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar10,"ref_gather_cell","malloc c2n of REF_GLOB negative");
          return 1;
        }
        local_1d0 = malloc((ulong)(uint)(local_1ec * iVar13) << 3);
        if (local_1d0 == (void *)0x0) {
          uVar10 = 0x839;
          local_1d0 = (void *)0x0;
LAB_0013c38c:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar10,"ref_gather_cell","malloc c2n of REF_GLOB NULL");
          return 2;
        }
        local_1ec = 0;
        if (0 < ref_cell->max) {
          iVar11 = 0;
          do {
            RVar1 = ref_cell_nodes(ref_cell,iVar11,local_a8);
            if (RVar1 == 0) {
              uVar2 = ref_cell_part(ref_cell,ref_node,iVar11,&local_1c4);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x83c,"ref_gather_cell",(ulong)uVar2,"part");
                return uVar2;
              }
              lVar14 = local_1b8;
              if (local_1b0->id == local_1c4) {
                if (0 < (int)uVar3) {
                  uVar6 = 0;
                  do {
                    iVar13 = local_a8[uVar6];
                    lVar8 = -1;
                    if (((-1 < (long)iVar13) && (iVar13 < ref_node->max)) &&
                       (lVar8 = ref_node->global[iVar13], lVar8 < 0)) {
                      lVar8 = -1;
                    }
                    *(long *)((long)local_1d0 + uVar6 * 8 + (long)(local_1ec * (int)local_1b8) * 8)
                         = lVar8;
                    uVar6 = uVar6 + 1;
                  } while (uVar15 != uVar6);
                }
                if ((int)local_1d8 < (int)local_1b8) {
                  lVar8 = local_1d8;
                  do {
                    *(long *)((long)local_1d0 + lVar8 * 8 + local_1ec * local_1b8 * 8) =
                         (long)local_a8[lVar8];
                    lVar8 = lVar8 + 1;
                  } while (local_1b8 != lVar8);
                }
                local_1ec = local_1ec + 1;
              }
            }
            iVar13 = (int)lVar14;
            iVar11 = iVar11 + 1;
            ref_cell = local_1e0;
          } while (iVar11 < local_1e0->max);
        }
        uVar3 = ref_mpi_gather_send(local_1b0,local_1d0,local_1ec * iVar13,2);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x848,"ref_gather_cell",(ulong)uVar3,"send c2n");
          return uVar3;
        }
        free(local_1d0);
      }
      local_1f4 = 0;
    }
  }
  return local_1f4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell(
    REF_NODE ref_node, REF_CELL ref_cell, REF_BOOL faceid_insted_of_c2n,
    REF_BOOL always_id, REF_BOOL swap_endian, REF_BOOL sixty_four_bit,
    REF_BOOL select_faceid, REF_INT faceid, REF_BOOL pad, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_LONG globals[REF_CELL_MAX_SIZE_PER + 1];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_INT size_per = ref_cell_size_per(ref_cell);
  REF_INT ncell;
  REF_GLOB *c2n;
  REF_INT c2n_int;
  REF_LONG c2n_long;
  REF_INT proc;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part &&
          (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid)) {
        for (node = 0; node < node_per; node++)
          globals[node] = ref_node_global(ref_node, nodes[node]) + 1;
        globals[node_per] = REF_EXPORT_MESHB_3D_ID;
        if (size_per > node_per) globals[node_per] = nodes[node_per];

        if (always_id && REF_CELL_PYR == ref_cell_type(ref_cell)) {
          REF_LONG n0, n1, n2, n3, n4;
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = globals[0];
          n1 = globals[3];
          n2 = globals[4];
          n3 = globals[1];
          n4 = globals[2];
          globals[0] = n0;
          globals[1] = n1;
          globals[2] = n2;
          globals[3] = n3;
          globals[4] = n4;
        }

        if (faceid_insted_of_c2n) {
          if (sixty_four_bit) {
            c2n_long = globals[node_per];
            if (swap_endian) SWAP_LONG(c2n_long);
            REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file), "long id");
          } else {
            c2n_int = (REF_INT)globals[node_per];
            if (swap_endian) SWAP_INT(c2n_int);
            REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
          }
        } else {
          for (node = 0; node < node_per; node++) {
            if (sixty_four_bit) {
              c2n_long = globals[node];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&c2n_long, sizeof(REF_LONG), 1, file),
                   "long cel node");
            } else {
              c2n_int = (REF_INT)globals[node];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&c2n_int, sizeof(REF_INT), 1, file),
                   "int cel node");
            }
          }
          if (pad) {
            REF_INT zero = 0;
            if (swap_endian) SWAP_INT(zero);
            REIS(1, fwrite(&(zero), sizeof(REF_INT), 1, file), "zero pad");
          }
          if (always_id) {
            if (sixty_four_bit) {
              c2n_long = globals[node_per];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                   "long id");
            } else {
              c2n_int = (REF_INT)globals[node_per];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
            }
          }
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      if (ncell > 0) {
        ref_malloc(c2n, ncell * size_per, REF_GLOB);
        RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * size_per, REF_GLOB_TYPE,
                                proc),
            "recv c2n");
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++)
            globals[node] = c2n[node + size_per * cell] + 1;
          globals[node_per] = REF_EXPORT_MESHB_3D_ID;
          if (size_per > node_per)
            globals[node_per] = c2n[node_per + size_per * cell];

          if (always_id && REF_CELL_PYR == ref_cell_type(ref_cell)) {
            REF_LONG n0, n1, n2, n3, n4;
            /* convention: square basis is 0-1-2-3
               (oriented counter clockwise like trias) and top vertex is 4 */
            n0 = globals[0];
            n1 = globals[3];
            n2 = globals[4];
            n3 = globals[1];
            n4 = globals[2];
            globals[0] = n0;
            globals[1] = n1;
            globals[2] = n2;
            globals[3] = n3;
            globals[4] = n4;
          }

          if (faceid_insted_of_c2n) {
            if (sixty_four_bit) {
              c2n_long = globals[node_per];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                   "long id");
            } else {
              c2n_int = (REF_INT)globals[node_per];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
            }
          } else {
            for (node = 0; node < node_per; node++) {
              if (sixty_four_bit) {
                c2n_long = globals[node];
                if (swap_endian) SWAP_LONG(c2n_long);
                REIS(1, fwrite(&c2n_long, sizeof(REF_LONG), 1, file),
                     "long cel node");
              } else {
                c2n_int = (REF_INT)globals[node];
                if (swap_endian) SWAP_INT(c2n_int);
                REIS(1, fwrite(&c2n_int, sizeof(REF_INT), 1, file),
                     "int cel node");
              }
            }
            if (pad) {
              REF_INT zero = 0;
              if (swap_endian) SWAP_INT(zero);
              REIS(1, fwrite(&(zero), sizeof(REF_INT), 1, file), "zero pad");
            }
            if (always_id) {
              if (sixty_four_bit) {
                c2n_long = globals[node_per];
                if (swap_endian) SWAP_LONG(c2n_long);
                REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                     "long id");
              } else {
                c2n_int = (REF_INT)globals[node_per];
                if (swap_endian) SWAP_INT(c2n_int);
                REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
              }
            }
          }
        }
        ref_free(c2n);
      }
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part &&
          (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid))
        ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    if (ncell > 0) {
      ref_malloc(c2n, ncell * size_per, REF_GLOB);
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part &&
            (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid)) {
          for (node = 0; node < node_per; node++)
            c2n[node + size_per * ncell] =
                ref_node_global(ref_node, nodes[node]);
          for (node = node_per; node < size_per; node++)
            c2n[node + size_per * ncell] = (REF_GLOB)nodes[node];
          ncell++;
        }
      }
      RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * size_per, REF_GLOB_TYPE),
          "send c2n");
      ref_free(c2n);
    }
  }

  return REF_SUCCESS;
}